

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signalinterrupt.cpp
# Opt level: O0

void __thiscall util::SignalInterrupt::SignalInterrupt(SignalInterrupt *this)

{
  long lVar1;
  bool bVar2;
  error_code *this_00;
  long in_FS_OFFSET;
  optional<TokenPipe> pipe;
  optional<TokenPipe> *in_stack_ffffffffffffff78;
  TokenPipeEnd *in_stack_ffffffffffffff80;
  TokenPipeEnd *in_stack_ffffffffffffff88;
  error_code *peVar3;
  TokenPipe *in_stack_ffffffffffffff90;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::atomic<bool>::atomic((atomic<bool> *)in_stack_ffffffffffffff78,false);
  TokenPipeEnd::TokenPipeEnd((TokenPipeEnd *)in_stack_ffffffffffffff78,0);
  TokenPipeEnd::TokenPipeEnd((TokenPipeEnd *)in_stack_ffffffffffffff78,0);
  TokenPipe::Make();
  bVar2 = std::optional::operator_cast_to_bool(in_stack_ffffffffffffff78);
  if (bVar2) {
    std::optional<TokenPipe>::operator->(in_stack_ffffffffffffff78);
    TokenPipe::TakeReadEnd(in_stack_ffffffffffffff90);
    TokenPipeEnd::operator=(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
    TokenPipeEnd::~TokenPipeEnd((TokenPipeEnd *)in_stack_ffffffffffffff78);
    std::optional<TokenPipe>::operator->(in_stack_ffffffffffffff78);
    TokenPipe::TakeWriteEnd(in_stack_ffffffffffffff90);
    TokenPipeEnd::operator=(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
    TokenPipeEnd::~TokenPipeEnd((TokenPipeEnd *)in_stack_ffffffffffffff78);
    std::optional<TokenPipe>::~optional(in_stack_ffffffffffffff78);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return;
    }
  }
  else {
    this_00 = (error_code *)__cxa_allocate_exception(0x20);
    peVar3 = this_00;
    std::error_code::error_code<std::io_errc,void>(this_00,(io_errc)((ulong)this_00 >> 0x20));
    std::ios_base::failure[abi:cxx11]::failure
              ((char *)peVar3,(error_code *)"Could not create TokenPipe");
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      __cxa_throw(this_00,&std::ios_base::failure[abi:cxx11]::typeinfo,
                  std::ios_base::failure[abi:cxx11]::~failure);
    }
  }
  __stack_chk_fail();
}

Assistant:

SignalInterrupt::SignalInterrupt() : m_flag{false}
{
#ifndef WIN32
    std::optional<TokenPipe> pipe = TokenPipe::Make();
    if (!pipe) throw std::ios_base::failure("Could not create TokenPipe");
    m_pipe_r = pipe->TakeReadEnd();
    m_pipe_w = pipe->TakeWriteEnd();
#endif
}